

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wlcStdin.c
# Opt level: O1

Vec_Str_t * Wlc_StdinCollectProblem(char *pDir)

{
  uint uVar1;
  ulong uVar2;
  int iVar3;
  uint uVar4;
  size_t sVar5;
  Vec_Str_t *pVVar6;
  char *pcVar7;
  ulong uVar8;
  uint uVar9;
  ulong uVar10;
  
  sVar5 = strlen(pDir);
  pVVar6 = (Vec_Str_t *)malloc(0x10);
  pVVar6->nCap = 1000;
  pVVar6->nSize = 0;
  pcVar7 = (char *)malloc(1000);
  pVVar6->pArray = pcVar7;
  iVar3 = fgetc(_stdin);
  if (iVar3 != -1) {
    sVar5 = (size_t)(int)sVar5;
    uVar8 = (ulong)pVVar6->nSize;
    uVar9 = pVVar6->nCap;
    pcVar7 = pVVar6->pArray;
    uVar2 = uVar8;
    do {
      uVar10 = uVar2 + 1;
      uVar4 = (uint)uVar8;
      if (uVar4 == uVar9) {
        if ((int)uVar9 < 0x10) {
          if (pcVar7 == (char *)0x0) {
            pcVar7 = (char *)malloc(0x10);
          }
          else {
            pcVar7 = (char *)realloc(pcVar7,0x10);
          }
          uVar9 = 0x10;
        }
        else {
          uVar1 = uVar9 * 2;
          if (SBORROW4(uVar9,uVar1) != 0 < (int)uVar9) {
            uVar9 = uVar1;
            if (pcVar7 == (char *)0x0) {
              pcVar7 = (char *)malloc((ulong)uVar1);
            }
            else {
              pcVar7 = (char *)realloc(pcVar7,(ulong)uVar1);
            }
          }
        }
      }
      pcVar7[uVar2] = (char)iVar3;
      if (((iVar3 == 0x29) && ((long)sVar5 <= (long)uVar10)) &&
         (iVar3 = strncmp(pcVar7 + (uVar10 - sVar5),pDir,sVar5), iVar3 == 0)) break;
      iVar3 = fgetc(_stdin);
      uVar8 = (ulong)(uVar4 + 1);
      uVar2 = uVar10;
    } while (iVar3 != -1);
    pVVar6->nSize = uVar4 + 1;
    pVVar6->nCap = uVar9;
    pVVar6->pArray = pcVar7;
  }
  uVar9 = pVVar6->nSize;
  uVar4 = pVVar6->nCap;
  if (uVar9 == uVar4) {
    if ((int)uVar4 < 0x10) {
      if (pVVar6->pArray == (char *)0x0) {
        pcVar7 = (char *)malloc(0x10);
      }
      else {
        pcVar7 = (char *)realloc(pVVar6->pArray,0x10);
      }
      sVar5 = 0x10;
    }
    else {
      sVar5 = (ulong)uVar4 * 2;
      if ((int)sVar5 <= (int)uVar4) goto LAB_001ca8a8;
      if (pVVar6->pArray == (char *)0x0) {
        pcVar7 = (char *)malloc(sVar5);
      }
      else {
        pcVar7 = (char *)realloc(pVVar6->pArray,sVar5);
      }
    }
    pVVar6->pArray = pcVar7;
    pVVar6->nCap = (int)sVar5;
  }
LAB_001ca8a8:
  pVVar6->nSize = uVar9 + 1;
  pVVar6->pArray[(int)uVar9] = '\0';
  return pVVar6;
}

Assistant:

Vec_Str_t * Wlc_StdinCollectProblem( char * pDir )
{
    int c, DirSize = strlen(pDir);
    Vec_Str_t * vInput = Vec_StrAlloc( 1000 );
    while ( (c = fgetc(stdin)) != EOF )
    {
        Vec_StrPush( vInput, (char)c );
        if ( c == ')' && Wlc_StdinCollectStop(vInput, pDir, DirSize) )
            break;
    }
    Vec_StrPush( vInput, '\0' );
    return vInput;
}